

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

void replaceFormatNameInFieldList(FMStructDescList l,char *orig,char *repl,int repl_size)

{
  char *__haystack;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  FMFieldList p_Var9;
  char *old;
  
  for (lVar7 = 0; l[lVar7].format_name != (char *)0x0; lVar7 = lVar7 + 1) {
    p_Var9 = l[lVar7].field_list;
    iVar8 = 0;
    while( true ) {
      pcVar6 = p_Var9[iVar8].field_name;
      if (pcVar6 == (char *)0x0) break;
      __haystack = p_Var9[iVar8].field_type;
      pcVar2 = strstr(__haystack,orig);
      if (pcVar2 != (char *)0x0) {
        if (repl == (char *)0x0) {
          free(pcVar6);
          free(l[lVar7].field_list[iVar8].field_type);
          while (p_Var9 = l[lVar7].field_list, p_Var9[iVar8].field_name != (char *)0x0) {
            p_Var9 = p_Var9 + iVar8;
            iVar1 = p_Var9[1].field_offset;
            p_Var9->field_size = p_Var9[1].field_size;
            p_Var9->field_offset = iVar1;
            pcVar6 = p_Var9[1].field_type;
            p_Var9->field_name = p_Var9[1].field_name;
            p_Var9->field_type = pcVar6;
          }
          iVar8 = iVar8 + -1;
        }
        else {
          sVar3 = strlen(__haystack);
          sVar4 = strlen(orig);
          sVar5 = strlen(repl);
          pcVar6 = (char *)malloc((sVar3 - sVar4) + sVar5 + 1);
          strncpy(pcVar6,__haystack,(long)pcVar2 - (long)__haystack);
          pcVar6[(long)pcVar2 - (long)__haystack] = '\0';
          strcat(pcVar6,repl);
          strcat(pcVar6,pcVar2 + sVar4);
          free(__haystack);
          p_Var9 = l[lVar7].field_list;
          p_Var9[iVar8].field_type = pcVar6;
          p_Var9[iVar8].field_size = repl_size;
        }
      }
      iVar8 = iVar8 + 1;
    }
  }
  return;
}

Assistant:

static void replaceFormatNameInFieldList(FMStructDescList l, const char *orig, const char *repl,
                                         int repl_size)
{
    int i = 0;
    while (l[i].format_name)
    {
        int j = 0;
        while (l[i].field_list[j].field_name)
        {
            char *loc;
            if ((loc = strstr(l[i].field_list[j].field_type, orig)))
            {
                if (repl)
                {
                    /* replace 'orig' with 'repl' */
                    char *old = (char *)l[i].field_list[j].field_type;
                    char *new = malloc(strlen(old) - strlen(orig) + strlen(repl) + 1);
                    strncpy(new, old, loc - old);
                    new[loc - old] = 0;
                    strcat(new, repl);
                    strcat(new, loc + strlen(orig));
                    free(old);
                    l[i].field_list[j].field_type = new;
                    l[i].field_list[j].field_size = repl_size;
                }
                else
                {
                    /* remove list item with 'orig'  Move higher elements down 1
                     */
                    int index = j;
                    free((char *)l[i].field_list[j].field_name);
                    free((char *)l[i].field_list[j].field_type);
                    while (l[i].field_list[index].field_name != NULL)
                    {
                        l[i].field_list[index] = l[i].field_list[index + 1];
                    }
                    j--; /* we've replaced this element, make sure we process
                            the one we replaced it with */
                }
            }
            j++;
        }
        i++;
    }
}